

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

bool __thiscall
QItemSelectionModel::rowIntersectsSelection(QItemSelectionModel *this,int row,QModelIndex *parent)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  long lVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ItemFlags IVar7;
  parameter_type pQVar8;
  QItemSelectionRange *pQVar9;
  int j;
  QItemSelectionRange *this_01;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QArrayDataPointer<QItemSelectionRange> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             *)(lVar1 + 0x78);
  pQVar8 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(this_00);
  if (pQVar8 == (parameter_type)0x0) {
LAB_00404e12:
    bVar3 = false;
  }
  else {
    bVar3 = QModelIndex::isValid(parent);
    if (bVar3) {
      pQVar8 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
               ::value(this_00);
      if (pQVar8 != (parent->m).ptr) goto LAB_00404e12;
    }
    local_50.d = *(Data **)(lVar1 + 0x80);
    local_50.ptr = *(QItemSelectionRange **)(lVar1 + 0x88);
    local_50.size = *(long *)(lVar1 + 0x90);
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QItemSelection::merge
              ((QItemSelection *)&local_50,(QItemSelection *)(lVar1 + 0x98),
               (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
               ((QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> *)(lVar1 + 0xb8))->
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>);
    if (local_50.size != 0) {
      QPersistentModelIndex::parent(&local_68,&(local_50.ptr)->tl);
      bVar3 = ::operator!=(&local_68,parent);
      if (!bVar3) {
        pQVar9 = local_50.ptr + local_50.size;
        for (this_01 = local_50.ptr; this_01 != pQVar9; this_01 = this_01 + 1) {
          iVar4 = QPersistentModelIndex::row(&this_01->tl);
          iVar5 = QPersistentModelIndex::row(&this_01->br);
          if ((iVar4 <= row) && (row <= iVar5)) {
            uVar6 = QPersistentModelIndex::column(&this_01->tl);
            iVar4 = QPersistentModelIndex::column(&this_01->br);
            while ((int)uVar6 <= iVar4) {
              QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::value(this_00);
              pQVar2 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
              (*(pQVar2->super_QObject)._vptr_QObject[0xc])
                        (&local_68,pQVar2,row,(ulong)uVar6,parent);
              IVar7 = QModelIndex::flags(&local_68);
              uVar6 = uVar6 + 1;
              if ((~(uint)IVar7.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                          super_QFlagsStorage<Qt::ItemFlag>.i & 0x21) == 0) {
                bVar3 = true;
                goto LAB_00404f2c;
              }
            }
          }
        }
      }
    }
    bVar3 = false;
LAB_00404f2c:
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QItemSelectionModel::rowIntersectsSelection(int row, const QModelIndex &parent) const
{
    Q_D(const QItemSelectionModel);
    if (!d->model.value())
        return false;
    if (parent.isValid() && d->model != parent.model())
         return false;

    QItemSelection sel = d->ranges;
    sel.merge(d->currentSelection, d->currentCommand);
    if (sel.isEmpty() || sel.constFirst().parent() != parent)
        return false;

    for (const QItemSelectionRange &range : std::as_const(sel)) {
        int top = range.top();
        int bottom = range.bottom();
        if (top <= row && bottom >= row) {
            int left = range.left();
            int right = range.right();
            for (int j = left; j <= right; j++) {
                if (isSelectableAndEnabled(d->model->index(row, j, parent).flags()))
                    return true;
            }
        }
    }

    return false;
}